

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryUnorderedTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true>::
TryRegisterDeletedPropertyIndex
          (SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *this,
          DynamicObject *object,int propertyIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var value;
  int propertyIndex_local;
  DynamicObject *object_local;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *this_local;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x33,"(object)","object");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IsReusablePropertyIndex(this,propertyIndex);
  if (bVar2) {
    bVar2 = TaggedInt::IsOverflow(-1);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                  ,0x3a,
                                  "(!TaggedInt::IsOverflow(PropertyIndexRanges<TPropertyIndex>::NoSlots))"
                                  ,
                                  "!TaggedInt::IsOverflow(PropertyIndexRanges<TPropertyIndex>::NoSlots)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    value = TaggedInt::ToVarUnchecked(this->deletedPropertyIndex);
    DynamicTypeHandler::SetSlotUnchecked(object,propertyIndex,value);
    this->deletedPropertyIndex = propertyIndex;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TryRegisterDeletedPropertyIndex(
        DynamicObject *const object,
        const TPropertyIndex propertyIndex)
    {
        Assert(object);

        if(!IsReusablePropertyIndex(propertyIndex))
        {
            return false;
        }

        Assert(!TaggedInt::IsOverflow(PropertyIndexRanges<TPropertyIndex>::NoSlots)); // the last deleted property's slot in the chain is going to store NoSlots as a tagged int

        this->SetSlotUnchecked(object, propertyIndex, TaggedInt::ToVarUnchecked(deletedPropertyIndex));
        deletedPropertyIndex = propertyIndex;
        return true;
    }